

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O0

void pl_computePhnHeur(mdef_t *md,ascr_t *a,pl_t *pl,int32 heutype,int32 win_strt,int32 win_efv)

{
  int32 *piVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  int32 *ph_lst;
  int32 curFrmPhnVar;
  int32 curPhn;
  int32 j;
  int32 i;
  int32 nState;
  int32 win_efv_local;
  int32 win_strt_local;
  int32 heutype_local;
  pl_t *pl_local;
  ascr_t *a_local;
  mdef_t *md_local;
  
  iVar2 = md->n_emit_state;
  piVar1 = pl->phn_heur_list;
  for (curFrmPhnVar = 0; curFrmPhnVar == md->cd2cisen[curFrmPhnVar]; curFrmPhnVar = curFrmPhnVar + 1
      ) {
    piVar1[(int)md->sen2cimap[curFrmPhnVar]] = 0;
  }
  curPhn = win_strt;
  if (heutype == 1) {
    for (; curPhn < win_efv; curPhn = curPhn + 1) {
      ph_lst._0_4_ = -0x80000000;
      for (curFrmPhnVar = 0; curFrmPhnVar == md->cd2cisen[curFrmPhnVar];
          curFrmPhnVar = curFrmPhnVar + 1) {
        if ((int32)ph_lst < a->cache_ci_senscr[curPhn][curFrmPhnVar]) {
          ph_lst._0_4_ = a->cache_ci_senscr[curPhn][curFrmPhnVar];
        }
        iVar2 = (int)md->sen2cimap[curFrmPhnVar];
        if (iVar2 != md->sen2cimap[curFrmPhnVar + 1]) {
          iVar3 = NO_UFLOW_ADD(piVar1[iVar2],(int32)ph_lst);
          piVar1[iVar2] = iVar3;
          ph_lst._0_4_ = -0x80000000;
        }
      }
    }
  }
  else if (heutype == 2) {
    for (; curPhn < win_efv; curPhn = curPhn + 1) {
      ph_lst._0_4_ = -0x80000000;
      for (curFrmPhnVar = 0; curFrmPhnVar == md->cd2cisen[curFrmPhnVar];
          curFrmPhnVar = curFrmPhnVar + 1) {
        ph_lst._0_4_ = NO_UFLOW_ADD(a->cache_ci_senscr[curPhn][curFrmPhnVar],(int32)ph_lst);
        iVar4 = (int)md->sen2cimap[curFrmPhnVar];
        if (iVar4 != md->sen2cimap[curFrmPhnVar + 1]) {
          iVar3 = NO_UFLOW_ADD(piVar1[iVar4],(int32)ph_lst / iVar2);
          piVar1[iVar4] = iVar3;
          ph_lst._0_4_ = -0x80000000;
        }
      }
    }
  }
  else if (heutype == 3) {
    for (; curPhn < win_efv; curPhn = curPhn + 1) {
      ph_lst._4_4_ = 0;
      ph_lst._0_4_ = -0x80000000;
      for (curFrmPhnVar = 0; curFrmPhnVar == md->cd2cisen[curFrmPhnVar];
          curFrmPhnVar = curFrmPhnVar + 1) {
        if ((ph_lst._4_4_ == 0) || (ph_lst._4_4_ != md->sen2cimap[curFrmPhnVar + -1])) {
          iVar3 = NO_UFLOW_ADD(piVar1[ph_lst._4_4_],a->cache_ci_senscr[curPhn][curFrmPhnVar]);
          piVar1[ph_lst._4_4_] = iVar3;
        }
        ph_lst._4_4_ = (int)md->sen2cimap[curFrmPhnVar];
        if ((int32)ph_lst < a->cache_ci_senscr[curPhn][curFrmPhnVar]) {
          ph_lst._0_4_ = a->cache_ci_senscr[curPhn][curFrmPhnVar];
        }
        if (md->sen2cimap[curFrmPhnVar] != md->sen2cimap[curFrmPhnVar + 1]) {
          iVar3 = NO_UFLOW_ADD(piVar1[ph_lst._4_4_],(int32)ph_lst);
          piVar1[ph_lst._4_4_] = iVar3;
          ph_lst._0_4_ = -0x80000000;
        }
      }
    }
  }
  return;
}

Assistant:

void
pl_computePhnHeur(mdef_t * md, ascr_t * a, pl_t * pl, int32 heutype,
                  int32 win_strt, int32 win_efv)
{
    int32 nState;
    int32 i, j;
    int32 curPhn, curFrmPhnVar; /* variables for phoneme lookahead computation */
    int32 *ph_lst;

    nState = mdef_n_emit_state(md);
    ph_lst = pl->phn_heur_list;

    /* Initializing all the phoneme heuristics for each phone to be 0 */
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->sen2cimap[j];      /*Just to save a warning */
        ph_lst[curPhn] = 0;
    }

    /* 20040503: ARCHAN, the code can be reduced to 10 lines, it is so
       organized such that there is no overhead in checking the
       heuristic type in the inner loop.  
     */
    /* One trick we use is to use sen2cimap to check phoneme ending boundary */


    if (heutype == 1) {         /* Taking Max */
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                curPhn = md->sen2cimap[j];
                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 2) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                curFrmPhnVar =
                    NO_UFLOW_ADD(a->cache_ci_senscr[i][j], curFrmPhnVar);
                curPhn = md->sen2cimap[j];

                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    curFrmPhnVar /= nState;     /* ARCHAN: I hate to do division ! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 3) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curPhn == 0 || curPhn != md->sen2cimap[j - 1])      /* dangerous hack! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn],
                                     a->cache_ci_senscr[i][j]);

                curPhn = md->sen2cimap[j];

                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                /* Update at the phone_end boundary */
                if (md->sen2cimap[j] != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }

#if 0
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->cd2cisen[j];
        E_INFO("phoneme heuristics scores at phn %d is %d\n", j,
               kb->phn_list[mdef->sen2cimap[j]]);
    }
#endif


}